

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

char * GetQuote(ConfigScanner *sc)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *__src;
  
  if (sc == (ConfigScanner *)0x0) {
    return (char *)0x0;
  }
  __src = sc->ptr;
  pcVar4 = __src;
  do {
    cVar1 = *pcVar4;
    if (cVar1 == '\\') {
      pcVar5 = pcVar4 + 1;
      sc->ptr = pcVar5;
      cVar1 = pcVar4[1];
    }
    else {
      if (cVar1 == '\0') {
        return (char *)0x0;
      }
      if (cVar1 == '\n') {
        return (char *)0x0;
      }
      if (cVar1 == '\r') {
        return (char *)0x0;
      }
      pcVar5 = pcVar4;
      if (cVar1 == '\"') {
        pcVar2 = (char *)calloc(1,(size_t)(pcVar4 + (1 - (long)__src)));
        pcVar5 = pcVar2;
        do {
          cVar1 = *__src;
          if (cVar1 == '\\') {
            cVar1 = __src[1];
            __src = __src + 1;
          }
          else if (cVar1 == '\"') {
            if (*pcVar4 != '\"') {
              return pcVar2;
            }
            sc->ptr = pcVar4 + 1;
            return pcVar2;
          }
          sVar3 = GetUTF8Length(cVar1);
          memcpy(pcVar5,__src,sVar3);
          __src = __src + sVar3;
          pcVar5 = pcVar5 + sVar3;
        } while( true );
      }
    }
    sVar3 = GetUTF8Length(cVar1);
    if (sVar3 == 0) {
      return (char *)0x0;
    }
    pcVar4 = pcVar5 + sVar3;
    sc->ptr = pcVar4;
  } while( true );
}

Assistant:

char *GetQuote(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return NULL;
	}
	char *start = sc->ptr;
	while (true)
	{
		char ch = *sc->ptr;
		if ((ch == '\r') || (ch == '\n') || (ch == '\0'))
		{
			return NULL;
		}
		else if (ch == '"')
		{
			break;
		}
		else if (ch == '\\')
		{
			ch = *++sc->ptr;
		}
		size_t step = GetUTF8Length(ch);
		if (step == 0)
		{
			return NULL;
		}
		sc->ptr += step;
	}
	size_t length = sc->ptr - start;
	char *temp = (char *)malloc(length + 1);
	memset(temp, 0, length + 1);
	char *s = start;
	char *d = temp;
	while (true)
	{
		char ch = *s;
		if (ch == '"')
		{
			break;
		}
		else if (ch == '\\')
		{
			ch = *++s;
		}
		size_t step = GetUTF8Length(ch);
		memcpy(d, s, step);
		s += step;
		d += step;
	}
	if (*sc->ptr == '"')
	{
		sc->ptr++;
	}
	return temp;
}